

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  int epollfd_00;
  uint fd_00;
  uint *puVar1;
  uint64_t uVar2;
  uv__io_s *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uv__iou *ctl_00;
  uv__queue *q_00;
  int *piVar8;
  bool bVar9;
  int _saved_errno;
  int reset_timeout;
  int user_timeout;
  int i;
  int op;
  int fd;
  int nfds;
  int count;
  int epollfd;
  int nevents;
  int have_signals;
  int have_iou_events;
  uint64_t base;
  sigset_t sigset;
  sigset_t *sigmask;
  uv__io_t *w;
  uv__queue *q;
  int real_timeout;
  uv__iou *iou;
  uv__iou *ctl;
  undefined4 local_3c50;
  epoll_event e;
  epoll_event *pe;
  uv__invalidate inv;
  epoll_event prep [256];
  epoll_event events [1024];
  uv__loop_internal_fields_t *lfields;
  int timeout_local;
  uv_loop_t *loop_local;
  
  puVar1 = (uint *)loop->internal_fields;
  ctl_00 = (uv__iou *)(puVar1 + 0x32);
  sigset.__val[0xf] = 0;
  if ((loop->flags & 1) != 0) {
    sigemptyset((sigset_t *)&base);
    sigaddset((sigset_t *)&base,0x1b);
    sigset.__val[0xf] = (unsigned_long)&base;
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                  ,0x559,"void uv__io_poll(uv_loop_t *, int)");
  }
  uVar2 = loop->time;
  fd = 0x30;
  bVar9 = (*puVar1 & 1) == 0;
  if (bVar9) {
    _saved_errno = 0;
    lfields._4_4_ = timeout;
  }
  else {
    lfields._4_4_ = 0;
    _saved_errno = timeout;
  }
  bVar9 = !bVar9;
  epollfd_00 = loop->backend_fd;
  memset((void *)((long)&ctl + 4),0,0xc);
  while (iVar6 = uv__queue_empty(&loop->watcher_queue), iVar6 == 0) {
    q_00 = uv__queue_head(&loop->watcher_queue);
    uv__queue_remove(q_00);
    uv__queue_init(q_00);
    user_timeout = 3;
    if (*(int *)((long)&q_00[1].next + 4) == 0) {
      user_timeout = 1;
    }
    *(undefined4 *)((long)&q_00[1].next + 4) = *(undefined4 *)&q_00[1].next;
    ctl._4_4_ = *(undefined4 *)&q_00[1].next;
    local_3c50 = *(undefined4 *)&q_00[1].prev;
    uv__epoll_ctl_prep(epollfd_00,ctl_00,(epoll_event (*) [256])&inv.nfds,user_timeout,
                       *(int *)&q_00[1].prev,(epoll_event *)((long)&ctl + 4));
  }
  inv.prep = (epoll_event (*) [256])&prep[0xff].data;
  pe = (epoll_event *)&inv.nfds;
  inv.events._0_4_ = -1;
  q._4_4_ = timeout;
LAB_00128a6f:
  do {
    if ((loop->nfds == 0) && (puVar1[0x73] == 0)) goto LAB_00128f8f;
    if (puVar1[0x50] != 0xffffffff) {
      while (*ctl_00->sqhead != **(uint32_t **)(puVar1 + 0x34)) {
        uv__epoll_ctl_flush(epollfd_00,ctl_00,(epoll_event (*) [256])&inv.nfds);
      }
    }
    if (lfields._4_4_ != 0) {
      uv__metrics_set_provider_entry_time(loop);
    }
    puVar1[0x30] = lfields._4_4_;
    iVar7 = epoll_pwait(epollfd_00,(epoll_event *)&prep[0xff].data,0x400,lfields._4_4_,
                        (__sigset_t *)sigset.__val[0xf]);
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    uv__update_time(loop);
    piVar8 = __errno_location();
    *piVar8 = iVar6;
    if (iVar7 == -1) {
      piVar8 = __errno_location();
      if (*piVar8 != 4) {
        __assert_fail("errno == EINTR",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                      ,0x5a1,"void uv__io_poll(uv_loop_t *, int)");
      }
    }
    else if ((iVar7 == 0) && (lfields._4_4_ == 0xffffffff)) {
      __assert_fail("timeout != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                    ,0x5a4,"void uv__io_poll(uv_loop_t *, int)");
    }
    if ((iVar7 == 0) || (iVar7 == -1)) {
      if (bVar9) {
        lfields._4_4_ = _saved_errno;
        bVar9 = false;
      }
      else if (iVar7 == 0) {
        return;
      }
    }
    else {
      bVar5 = false;
      bVar4 = false;
      count = 0;
      *(epoll_event ***)(puVar1 + 0x76) = &pe;
      inv.events._0_4_ = iVar7;
      for (reset_timeout = 0; reset_timeout < iVar7; reset_timeout = reset_timeout + 1) {
        e.data.ptr = &prep[(long)reset_timeout + 0xff].data;
        fd_00 = *(uint *)((long)&prep[(long)reset_timeout + 0xff].data + 4);
        if (fd_00 != 0xffffffff) {
          if (fd_00 == puVar1[0x72]) {
            uv__poll_io_uring(loop,(uv__iou *)(puVar1 + 0x54));
            bVar5 = true;
          }
          else {
            if ((int)fd_00 < 0) {
              __assert_fail("fd >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                            ,0x5c7,"void uv__io_poll(uv_loop_t *, int)");
            }
            if (loop->nwatchers <= fd_00) {
              __assert_fail("(unsigned) fd < loop->nwatchers",
                            "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                            ,0x5c8,"void uv__io_poll(uv_loop_t *, int)");
            }
            puVar3 = loop->watchers[(int)fd_00];
            if (puVar3 == (uv__io_s *)0x0) {
              uv__epoll_ctl_prep(epollfd_00,ctl_00,(epoll_event (*) [256])&inv.nfds,2,fd_00,
                                 (epoll_event *)e.data.ptr);
            }
            else {
              *(uint *)e.data.ptr = (puVar3->pevents | 0x18) & *e.data.ptr;
              if ((*e.data.ptr == 8) || (*e.data.ptr == 0x10)) {
                *(uint *)e.data.ptr = puVar3->pevents & 0x2007 | *e.data.ptr;
              }
              if (*e.data.ptr != 0) {
                if (puVar3 == &loop->signal_io_watcher) {
                  bVar4 = true;
                }
                else {
                  uv__metrics_update_idle_time(loop);
                  (*puVar3->cb)(loop,puVar3,*e.data.ptr);
                }
                count = count + 1;
              }
            }
          }
        }
      }
      *(long *)((long)loop->internal_fields + 0x10) =
           (long)count + *(long *)((long)loop->internal_fields + 0x10);
      if (bVar9) {
        lfields._4_4_ = _saved_errno;
        bVar9 = false;
        *(long *)((long)loop->internal_fields + 0x18) =
             (long)count + *(long *)((long)loop->internal_fields + 0x18);
      }
      if (bVar4) {
        uv__metrics_update_idle_time(loop);
        (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
      }
      puVar1[0x76] = 0;
      puVar1[0x77] = 0;
      if ((bVar5) || (bVar4)) goto LAB_00128f8f;
      if (count != 0) {
        if ((iVar7 != 0x400) || (fd = fd + -1, fd == 0)) goto LAB_00128f8f;
        lfields._4_4_ = 0;
        goto LAB_00128a6f;
      }
    }
    if (lfields._4_4_ == 0) goto LAB_00128f8f;
    if (lfields._4_4_ != 0xffffffff) {
      if ((int)lfields._4_4_ < 1) {
        __assert_fail("timeout > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                      ,0x623,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._4_4_ = q._4_4_ - ((int)loop->time - (int)uVar2);
      lfields._4_4_ = q._4_4_;
      if ((int)q._4_4_ < 1) {
LAB_00128f8f:
        if (puVar1[0x50] != 0xffffffff) {
          while (*ctl_00->sqhead != **(uint32_t **)(puVar1 + 0x34)) {
            uv__epoll_ctl_flush(epollfd_00,ctl_00,(epoll_event (*) [256])&inv.nfds);
          }
        }
        return;
      }
    }
  } while( true );
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  uv__loop_internal_fields_t* lfields;
  struct epoll_event events[1024];
  struct epoll_event prep[256];
  struct uv__invalidate inv;
  struct epoll_event* pe;
  struct epoll_event e;
  struct uv__iou* ctl;
  struct uv__iou* iou;
  int real_timeout;
  struct uv__queue* q;
  uv__io_t* w;
  sigset_t* sigmask;
  sigset_t sigset;
  uint64_t base;
  int have_iou_events;
  int have_signals;
  int nevents;
  int epollfd;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  lfields = uv__get_internal_fields(loop);
  ctl = &lfields->ctl;
  iou = &lfields->iou;

  sigmask = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (lfields->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  epollfd = loop->backend_fd;

  memset(&e, 0, sizeof(e));

  while (!uv__queue_empty(&loop->watcher_queue)) {
    q = uv__queue_head(&loop->watcher_queue);
    w = uv__queue_data(q, uv__io_t, watcher_queue);
    uv__queue_remove(q);
    uv__queue_init(q);

    op = EPOLL_CTL_MOD;
    if (w->events == 0)
      op = EPOLL_CTL_ADD;

    w->events = w->pevents;
    e.events = w->pevents;
    e.data.fd = w->fd;

    uv__epoll_ctl_prep(epollfd, ctl, &prep, op, w->fd, &e);
  }

  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;

  for (;;) {
    if (loop->nfds == 0)
      if (iou->in_flight == 0)
        break;

    /* All event mask mutations should be visible to the kernel before
     * we enter epoll_pwait().
     */
    if (ctl->ringfd != -1)
      while (*ctl->sqhead != *ctl->sqtail)
        uv__epoll_ctl_flush(epollfd, ctl, &prep);

    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* Store the current timeout in a location that's globally accessible so
     * other locations like uv__work_done() can determine whether the queue
     * of events in the callback were waiting when poll was called.
     */
    lfields->current_timeout = timeout;

    nfds = epoll_pwait(epollfd, events, ARRAY_SIZE(events), timeout, sigmask);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == -1)
      assert(errno == EINTR);
    else if (nfds == 0)
      /* Unlimited timeout should only return with events or signal. */
      assert(timeout != -1);

    if (nfds == 0 || nfds == -1) {
      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      } else if (nfds == 0) {
        return;
      }

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_iou_events = 0;
    have_signals = 0;
    nevents = 0;

    inv.nfds = nfds;
    lfields->inv = &inv;

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      if (fd == iou->ringfd) {
        uv__poll_io_uring(loop, iou);
        have_iou_events = 1;
        continue;
      }

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        uv__epoll_ctl_prep(epollfd, ctl, &prep, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    uv__metrics_inc_events(loop, nevents);
    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
      uv__metrics_inc_events_waiting(loop, nevents);
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    lfields->inv = NULL;

    if (have_iou_events != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (have_signals != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      break;
    }

update_timeout:
    if (timeout == 0)
      break;

    if (timeout == -1)
      continue;

    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      break;

    timeout = real_timeout;
  }

  if (ctl->ringfd != -1)
    while (*ctl->sqhead != *ctl->sqtail)
      uv__epoll_ctl_flush(epollfd, ctl, &prep);
}